

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

void __thiscall
t_markdown_generator::print_const_value
          (t_markdown_generator *this,t_type *type,t_const_value *tvalue)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int *p_Var3;
  undefined4 uVar4;
  t_program *ptVar5;
  pointer pcVar6;
  pointer __n;
  undefined1 *puVar7;
  string *psVar8;
  t_const_value_type tVar9;
  int iVar10;
  ostream *poVar11;
  long *plVar12;
  _func_int **pp_Var13;
  undefined4 extraout_var;
  undefined8 *puVar14;
  undefined8 uVar15;
  _Base_ptr p_Var16;
  int64_t iVar17;
  _Rb_tree_node_base *p_Var18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var_00;
  long *plVar19;
  ulong *puVar20;
  size_type *psVar21;
  _func_int *p_Var22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [8];
  char *pcVar26;
  ofstream_with_content_based_conditional_update *poVar27;
  t_type *ptVar28;
  t_type *type_00;
  bool bVar29;
  string fname;
  string name;
  undefined1 local_1a0 [8];
  undefined1 local_198 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [2];
  string local_170;
  string local_150;
  t_markdown_generator *local_130;
  ofstream_with_content_based_conditional_update *local_128;
  uint local_11c;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  _Rb_tree_node_base *local_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  tVar9 = t_const_value::get_type(tvalue);
  if (tVar9 == CV_IDENTIFIER) {
    ptVar5 = (this->super_t_generator).program_;
    pcVar6 = (ptVar5->name_)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar6,pcVar6 + (ptVar5->name_)._M_string_length);
    make_file_name((string *)local_1a0,this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    paVar2 = &local_150.field_2;
    pcVar6 = (tvalue->identifierVal_)._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar6,pcVar6 + (tvalue->identifierVal_)._M_string_length);
    escape_html(&local_170,this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"[```",4);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&this->f_out_,local_170._M_dataplus._M_p,
                         local_170._M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_1a0,(_func_int *)((long)local_198 + (long)local_1a0));
    make_file_link(&local_70,this,&local_90);
    plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x391aec);
    plVar19 = plVar12 + 2;
    if ((long *)*plVar12 == plVar19) {
      local_a0 = *plVar19;
      lStack_98 = plVar12[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar19;
      local_b0 = (long *)*plVar12;
    }
    local_a8 = plVar12[1];
    *plVar12 = (long)plVar19;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    pcVar26 = "#constant-";
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar20 = (ulong *)(plVar12 + 2);
    if ((ulong *)*plVar12 == puVar20) {
      local_e8 = *puVar20;
      lStack_e0 = plVar12[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *puVar20;
      local_f8 = (ulong *)*plVar12;
    }
    local_f0 = plVar12[1];
    *plVar12 = (long)puVar20;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    str_to_id(&local_d0,(t_markdown_generator *)pcVar26,&local_170);
    uVar23 = 0xf;
    if (local_f8 != &local_e8) {
      uVar23 = local_e8;
    }
    if (uVar23 < local_d0._M_string_length + local_f0) {
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar15 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_d0._M_string_length + local_f0) goto LAB_00241b6c;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f8);
    }
    else {
LAB_00241b6c:
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d0._M_dataplus._M_p);
    }
    local_118 = &local_108;
    puVar1 = puVar14 + 2;
    if ((undefined8 *)*puVar14 == puVar1) {
      local_108 = *puVar1;
      uStack_100 = puVar14[3];
    }
    else {
      local_108 = *puVar1;
      local_118 = (undefined8 *)*puVar14;
    }
    local_110 = puVar14[1];
    *puVar14 = puVar1;
    puVar14[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar21 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_150.field_2._M_allocated_capacity = *psVar21;
      local_150.field_2._8_8_ = plVar12[3];
      local_150._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_150.field_2._M_allocated_capacity = *psVar21;
      local_150._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_150._M_string_length = plVar12[1];
    *plVar12 = (long)psVar21;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,local_150._M_dataplus._M_p,local_150._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    psVar8 = &local_170;
LAB_00241ed2:
    puVar7 = (undefined1 *)(&(psVar8->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7 != &psVar8->field_2) {
      operator_delete(puVar7);
    }
    if (local_1a0 == (undefined1  [8])(local_198 + 8)) {
      return;
    }
LAB_00241ef2:
    operator_delete((void *)local_1a0);
    return;
  }
  pp_Var13 = (type->super_t_doc)._vptr_t_doc;
  while (iVar10 = (*pp_Var13[9])(type), (char)iVar10 != '\0') {
    type = t_typedef::get_type((t_typedef *)type);
    pp_Var13 = (((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc;
  }
  iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[5])(type);
  if ((char)iVar10 == '\0') {
    iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[10])(type);
    if ((char)iVar10 == '\0') {
      iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xb])(type);
      local_130 = this;
      if (((char)iVar10 == '\0') &&
         (iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xc])(type),
         (char)iVar10 == '\0')) {
        iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
        if ((char)iVar10 != '\0') {
          poVar27 = &this->f_out_;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"{ ",2);
          std::
          _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
          ::_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      *)local_1a0,
                     (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      *)tvalue);
          p_Var18 = (_Rb_tree_node_base *)CONCAT44(local_190[0]._12_4_,local_190[0]._8_4_);
          if (p_Var18 != (_Rb_tree_node_base *)local_198) {
            bVar29 = true;
            do {
              if (!bVar29) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,", ",2);
              }
              print_const_value(local_130,*(t_type **)&((t_typedef *)type)->forward_,
                                *(t_const_value **)(p_Var18 + 1));
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27," = ",3);
              print_const_value(local_130,
                                (t_type *)
                                (((t_typedef *)((long)type + 0xb8))->super_t_type).super_t_doc.
                                _vptr_t_doc,(t_const_value *)p_Var18[1]._M_parent);
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18);
              bVar29 = false;
            } while (p_Var18 != (_Rb_tree_node_base *)local_198);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27," }",2);
          std::
          _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
          ::~_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       *)local_1a0);
          return;
        }
        iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
        if ((char)iVar10 == '\0') {
          iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
          poVar27 = &this->f_out_;
          if ((char)iVar10 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar27,"UNKNOWN TYPE",0xc);
            return;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"{ ",2);
          std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                    ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0,
                     &tvalue->listVal_);
          if (local_1a0 != local_198) {
            bVar29 = true;
            auVar25 = local_1a0;
            do {
              if (!bVar29) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,", ",2);
              }
              print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                                *(t_const_value **)auVar25);
              auVar25 = (undefined1  [8])((long)auVar25 + 8);
              bVar29 = false;
            } while (auVar25 != local_198);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27," }",2);
        }
        else {
          poVar27 = &this->f_out_;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"{ ",2);
          std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                    ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)local_1a0,
                     &tvalue->listVal_);
          if (local_1a0 != local_198) {
            bVar29 = true;
            auVar25 = local_1a0;
            do {
              if (!bVar29) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,", ",2);
              }
              print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                                *(t_const_value **)auVar25);
              auVar25 = (undefined1  [8])((long)auVar25 + 8);
              bVar29 = false;
            } while (auVar25 != local_198);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27," }",2);
        }
        if (local_1a0 == (undefined1  [8])0x0) {
          return;
        }
        goto LAB_00241ef2;
      }
      local_128 = &this->f_out_;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,"{ ",2);
      p_Var16 = (tvalue->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_d8 = &(tvalue->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var16 != local_d8) {
        p_Var3 = (_func_int *)(local_198 + 8);
        uVar15 = CONCAT71((int7)((ulong)local_d8 >> 8),1);
        do {
          local_11c = (uint)uVar15;
          ptVar28 = ((t_typedef *)type)->type_;
          if (ptVar28 == (t_type *)(((t_typedef *)type)->symbolic_)._M_dataplus._M_p) {
            type_00 = (t_type *)0x0;
          }
          else {
            type_00 = (t_type *)0x0;
            do {
              pp_Var13 = (ptVar28->super_t_doc)._vptr_t_doc;
              lVar24 = *(long *)(*(long *)(p_Var16 + 1) + 0x48);
              local_1a0 = (undefined1  [8])p_Var3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1a0,lVar24,
                         *(long *)(*(long *)(p_Var16 + 1) + 0x50) + lVar24);
              __n = (pointer)pp_Var13[0xe];
              if ((undefined1  [8])__n == local_198) {
                if (__n == (pointer)0x0) {
                  bVar29 = true;
                }
                else {
                  iVar10 = bcmp(pp_Var13[0xd],(void *)local_1a0,(size_t)__n);
                  bVar29 = iVar10 == 0;
                }
              }
              else {
                bVar29 = false;
              }
              if (local_1a0 != (undefined1  [8])p_Var3) {
                operator_delete((void *)local_1a0);
              }
              if (bVar29) {
                type_00 = (t_type *)(ptVar28->super_t_doc)._vptr_t_doc[0xc];
              }
              ptVar28 = (t_type *)&(ptVar28->super_t_doc).doc_;
            } while (ptVar28 != (t_type *)(((t_typedef *)type)->symbolic_)._M_dataplus._M_p);
          }
          if (type_00 == (t_type *)0x0) {
            __return_storage_ptr__ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
            std::operator+(&local_170,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar10));
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
            local_1a0 = (undefined1  [8])*puVar14;
            p_Var22 = (_func_int *)(puVar14 + 2);
            if (local_1a0 == (undefined1  [8])p_Var22) {
              local_190[0]._0_8_ = *(undefined8 *)p_Var22;
              local_190[0]._8_4_ = *(undefined4 *)(puVar14 + 3);
              local_190[0]._12_4_ = *(undefined4 *)((long)puVar14 + 0x1c);
              local_1a0 = (undefined1  [8])p_Var3;
            }
            else {
              local_190[0]._0_8_ = *(undefined8 *)p_Var22;
            }
            local_198 = (undefined1  [8])puVar14[1];
            *puVar14 = p_Var22;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            lVar24 = *(long *)(*(long *)(p_Var16 + 1) + 0x48);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,lVar24,*(long *)(*(long *)(p_Var16 + 1) + 0x50) + lVar24
                      );
            std::operator+(__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a0,&local_150);
            __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          if ((local_11c & 1) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_128,", ",2);
          }
          lVar24 = *(long *)(*(long *)(p_Var16 + 1) + 0x48);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,lVar24,*(long *)(*(long *)(p_Var16 + 1) + 0x50) + lVar24);
          escape_html((string *)local_1a0,local_130,&local_170);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_128,(char *)local_1a0,(long)local_198);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
          if (local_1a0 != (undefined1  [8])p_Var3) {
            operator_delete((void *)local_1a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          print_const_value(local_130,type_00,(t_const_value *)p_Var16[1]._M_parent);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          uVar15 = 0;
        } while (p_Var16 != local_d8);
      }
      pcVar26 = " }";
      lVar24 = 2;
      poVar27 = local_128;
      goto LAB_002420af;
    }
    iVar10 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
    escape_html((string *)local_1a0,this,(string *)CONCAT44(extraout_var,iVar10));
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&this->f_out_,(char *)local_1a0,(long)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
    t_const_value::get_identifier_name_abi_cxx11_(&local_150,tvalue);
    escape_html(&local_170,this,&local_150);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,local_170._M_dataplus._M_p,local_170._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    psVar8 = &local_150;
    goto LAB_00241ed2;
  }
  uVar4 = *(undefined4 *)&((t_typedef *)type)->type_;
  poVar27 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,"```",3);
  switch(uVar4) {
  case 1:
    t_generator::get_escaped_string_abi_cxx11_(&local_170,&this->super_t_generator,tvalue);
    escape_html((string *)local_1a0,this,&local_170);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar27,(char *)local_1a0,(long)local_198);
    if (local_1a0 != (undefined1  [8])(local_198 + 8)) {
      operator_delete((void *)local_1a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    break;
  case 2:
    iVar17 = t_const_value::get_integer(tvalue);
    pcVar26 = "true";
    if (iVar17 == 0) {
      pcVar26 = "false";
    }
    uVar23 = (ulong)(iVar17 == 0) | 4;
    goto LAB_00241f94;
  case 3:
  case 4:
  case 5:
  case 6:
switchD_002419bd_caseD_3:
    t_const_value::get_integer(tvalue);
    std::ostream::_M_insert<long>((long)poVar27);
    break;
  case 7:
    tVar9 = t_const_value::get_type(tvalue);
    if (tVar9 == CV_INTEGER) goto switchD_002419bd_caseD_3;
    std::ostream::_M_insert<double>(tvalue->doubleVal_);
    break;
  default:
    pcVar26 = "UNKNOWN BASE TYPE";
    uVar23 = 0x11;
LAB_00241f94:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar26,uVar23);
  }
  pcVar26 = "```";
  lVar24 = 3;
LAB_002420af:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar27,pcVar26,lVar24);
  return;
}

Assistant:

void t_markdown_generator::print_const_value(t_type* type, t_const_value* tvalue) {

  // if tvalue is an identifier, the constant content is already shown elsewhere
  if (tvalue->get_type() == t_const_value::CV_IDENTIFIER) {
    string fname = make_file_name(program_->get_name());
    string name = escape_html(tvalue->get_identifier());
    f_out_ << "[```" << name << "```](" 
      + make_file_link(fname) 
      + "#constant-" + str_to_id(name) + ")";
    return;
  }

  t_type* truetype = type;
  while (truetype->is_typedef()) {
    truetype = ((t_typedef*)truetype)->get_type();
  }

  bool first = true;
  if (truetype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)truetype)->get_base();
    f_out_ << "```";
    switch (tbase) {
    case t_base_type::TYPE_STRING: 
      f_out_ << escape_html(get_escaped_string(tvalue));
      break;
    case t_base_type::TYPE_BOOL:
      f_out_ << ((tvalue->get_integer() != 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I16:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I32:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I64:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (tvalue->get_type() == t_const_value::CV_INTEGER) {
        f_out_ << tvalue->get_integer();
      } else {
        f_out_ << tvalue->get_double();
      }
      break;
    default:
      f_out_ << "UNKNOWN BASE TYPE";
      break;
    }
    f_out_ << "```";
  } else if (truetype->is_enum()) {
    f_out_ << escape_html(truetype->get_name()) << "."
           << escape_html(tvalue->get_identifier_name());
  } else if (truetype->is_struct() || truetype->is_xception()) {
    f_out_ << "{ ";
    const vector<t_field*>& fields = ((t_struct*)truetype)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + truetype->get_name() + " has no field "
            + v_iter->first->get_string();
      }
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      f_out_ << escape_html(v_iter->first->get_string()) << " = ";
      print_const_value(field_type, v_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_map()) {
    f_out_ << "{ ";
    map<t_const_value*, t_const_value*, t_const_value::value_compare> map_elems = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator map_iter;
    for (map_iter = map_elems.begin(); map_iter != map_elems.end(); map_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_map*)truetype)->get_key_type(), map_iter->first);
      f_out_ << " = ";
      print_const_value(((t_map*)truetype)->get_val_type(), map_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_list()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_list*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else if (truetype->is_set()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_set*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else {
    f_out_ << "UNKNOWN TYPE";
  }
}